

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int identify_regions(FIRSTPASS_STATS *stats_start,int total_frames,int offset,REGIONS *regions,
                    int *total_regions)

{
  int iVar1;
  int last_idx;
  int iVar2;
  REGIONS *regions_00;
  double *filt_intra_err_00;
  double *filt_coded_err_00;
  REGIONS *regions_01;
  int *piVar3;
  long lVar4;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  FIRSTPASS_STATS *in_RDI;
  int *in_R8;
  int i;
  int last;
  int start;
  int num_regions;
  int next_scenecut;
  int this_last;
  int this_start;
  int cur_region;
  double *grad_coded;
  double *filt_coded_err;
  double *filt_intra_err;
  REGIONS *temp_regions;
  int k;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int last_00;
  int start_idx;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar6;
  int local_4;
  
  if (in_ESI < 2) {
    local_4 = 0;
  }
  else {
    regions_00 = (REGIONS *)aom_malloc(0x2a96fd);
    filt_intra_err_00 =
         (double *)
         aom_calloc(CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    filt_coded_err_00 =
         (double *)
         aom_calloc(CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    regions_01 = (REGIONS *)
                 aom_calloc(CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((((regions_00 != (REGIONS *)0x0) && (filt_intra_err_00 != (double *)0x0)) &&
        (filt_coded_err_00 != (double *)0x0)) && (regions_01 != (REGIONS *)0x0)) {
      memset(regions_00,0,(long)in_ESI * 0x38);
      iVar5 = 0;
      start_idx = 0;
      do {
        iVar1 = find_next_scenecut((FIRSTPASS_STATS *)
                                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                   (int)((ulong)regions_00 >> 0x20),(int)regions_00);
        if (iVar1 < 0) {
          last_idx = in_ESI + -1;
        }
        else {
          last_idx = iVar1 + -1;
        }
        last_00 = last_idx;
        smooth_filter_stats(in_RDI,start_idx,last_idx,filt_intra_err_00,filt_coded_err_00);
        get_gradient(filt_coded_err_00,start_idx,last_00,(double *)regions_01);
        iVar2 = find_stable_regions(in_RDI,(double *)regions_01,start_idx,last_00,regions_00);
        adjust_unstable_region_bounds(_this_start,_next_scenecut,_start);
        get_region_stats((FIRSTPASS_STATS *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (REGIONS *)CONCAT44(last_idx,in_stack_ffffffffffffff88),0);
        find_blending_regions
                  ((FIRSTPASS_STATS *)CONCAT44(total_frames,offset),regions,total_regions);
        cleanup_blendings((REGIONS *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          &regions_00->start);
        iVar6 = 0;
        while (iVar6 < iVar2) {
          if (regions_00[iVar6].type == STABLE_REGION) {
            in_stack_ffffffffffffff94 = regions_00[iVar6].last;
            in_stack_ffffffffffffff90 = regions_00[iVar6].start;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff90;
            for (; in_stack_ffffffffffffff90 <= in_stack_ffffffffffffff94;
                in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
              if (in_RDI[in_stack_ffffffffffffff90].is_flash != 0) {
                insert_region((int)((ulong)filt_intra_err_00 >> 0x20),(int)filt_intra_err_00,
                              (REGION_TYPES)((ulong)filt_coded_err_00 >> 0x20),regions_01,
                              (int *)CONCAT44(iVar5,start_idx),(int *)CONCAT44(last_00,iVar1));
              }
            }
            iVar6 = iVar6 + 1;
          }
          else {
            iVar6 = iVar6 + 1;
          }
        }
        cleanup_regions((REGIONS *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (int *)CONCAT44(last_idx,in_stack_ffffffffffffff88));
        for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < iVar2;
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
          if ((regions_00[in_stack_ffffffffffffffd4].last <
               regions_00[in_stack_ffffffffffffffd4].start) &&
             (in_stack_ffffffffffffffd4 == iVar2 + -1)) {
            iVar2 = iVar2 + -1;
            break;
          }
          memcpy((void *)(in_RCX + (long)(in_stack_ffffffffffffffd4 + iVar5) * 0x38),
                 regions_00 + in_stack_ffffffffffffffd4,0x38);
        }
        iVar5 = iVar2 + iVar5;
        if (iVar1 < 0) {
          *in_R8 = iVar5;
          get_region_stats((FIRSTPASS_STATS *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (REGIONS *)CONCAT44(last_idx,in_stack_ffffffffffffff88),0);
          for (iVar5 = 0; iVar5 < *in_R8; iVar5 = iVar5 + 1) {
            if ((*(int *)(in_RCX + (long)iVar5 * 0x38 + 0x30) == 2) &&
               (0.8 <= *(double *)(in_RCX + (long)iVar5 * 0x38 + 0x10) *
                       (1.0 - in_RDI[*(int *)(in_RCX + (long)iVar5 * 0x38)].noise_var /
                              *(double *)(in_RCX + (long)iVar5 * 0x38 + 0x20)))) {
              *(undefined4 *)(in_RCX + (long)iVar5 * 0x38 + 0x30) = 1;
            }
          }
          cleanup_regions((REGIONS *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (int *)CONCAT44(last_idx,in_stack_ffffffffffffff88));
          get_region_stats((FIRSTPASS_STATS *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (REGIONS *)CONCAT44(last_idx,in_stack_ffffffffffffff88),0);
          for (iVar5 = 0; iVar5 < *in_R8; iVar5 = iVar5 + 1) {
            piVar3 = (int *)(in_RCX + (long)iVar5 * 0x38);
            *piVar3 = in_EDX + *piVar3;
            lVar4 = in_RCX + (long)iVar5 * 0x38;
            *(int *)(lVar4 + 4) = in_EDX + *(int *)(lVar4 + 4);
          }
          free_firstpass_stats_buffers
                    ((REGIONS *)CONCAT44(last_00,iVar1),
                     (double *)CONCAT44(iVar2,in_stack_ffffffffffffff98),
                     (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (double *)CONCAT44(last_idx,in_stack_ffffffffffffff88));
          return 0;
        }
        *(undefined4 *)(in_RCX + (long)iVar5 * 0x38 + 0x30) = 2;
        *(int *)(in_RCX + (long)iVar5 * 0x38) = iVar1;
        *(int *)(in_RCX + (long)iVar5 * 0x38 + 4) = iVar1;
        iVar5 = iVar5 + 1;
        start_idx = iVar1 + 1;
      } while( true );
    }
    free_firstpass_stats_buffers
              ((REGIONS *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (double *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int identify_regions(const FIRSTPASS_STATS *const stats_start,
                            int total_frames, int offset, REGIONS *regions,
                            int *total_regions) {
  int k;
  if (total_frames <= 1) return 0;

  // store the initial decisions
  REGIONS *temp_regions =
      (REGIONS *)aom_malloc(total_frames * sizeof(temp_regions[0]));
  // buffers for filtered stats
  double *filt_intra_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_intra_err));
  double *filt_coded_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_coded_err));
  double *grad_coded = (double *)aom_calloc(total_frames, sizeof(*grad_coded));
  if (!(temp_regions && filt_intra_err && filt_coded_err && grad_coded)) {
    free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                                 grad_coded);
    return -1;
  }
  av1_zero_array(temp_regions, total_frames);

  int cur_region = 0, this_start = 0, this_last;

  int next_scenecut = -1;
  do {
    // first get the obvious scenecuts
    next_scenecut =
        find_next_scenecut(stats_start, this_start, total_frames - 1);
    this_last = (next_scenecut >= 0) ? (next_scenecut - 1) : total_frames - 1;

    // low-pass filter the needed stats
    smooth_filter_stats(stats_start, this_start, this_last, filt_intra_err,
                        filt_coded_err);
    get_gradient(filt_coded_err, this_start, this_last, grad_coded);

    // find tentative stable regions and unstable regions
    int num_regions = find_stable_regions(stats_start, grad_coded, this_start,
                                          this_last, temp_regions);

    adjust_unstable_region_bounds(stats_start, temp_regions, &num_regions);

    get_region_stats(stats_start, temp_regions, num_regions);

    // Try to identify blending regions in the unstable regions
    find_blending_regions(stats_start, temp_regions, &num_regions);
    cleanup_blendings(temp_regions, &num_regions);

    // The flash points should all be considered high variance points
    k = 0;
    while (k < num_regions) {
      if (temp_regions[k].type != STABLE_REGION) {
        k++;
        continue;
      }
      int start = temp_regions[k].start;
      int last = temp_regions[k].last;
      for (int i = start; i <= last; i++) {
        if (stats_start[i].is_flash) {
          insert_region(i, i, HIGH_VAR_REGION, temp_regions, &num_regions, &k);
        }
      }
      k++;
    }
    cleanup_regions(temp_regions, &num_regions);

    // copy the regions in the scenecut group
    for (k = 0; k < num_regions; k++) {
      if (temp_regions[k].last < temp_regions[k].start &&
          k == num_regions - 1) {
        num_regions--;
        break;
      }
      regions[k + cur_region] = temp_regions[k];
    }
    cur_region += num_regions;

    // add the scenecut region
    if (next_scenecut > -1) {
      // add the scenecut region, and find the next scenecut
      regions[cur_region].type = SCENECUT_REGION;
      regions[cur_region].start = next_scenecut;
      regions[cur_region].last = next_scenecut;
      cur_region++;
      this_start = next_scenecut + 1;
    }
  } while (next_scenecut >= 0);

  *total_regions = cur_region;
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    // If scenecuts are very minor, mark them as high variance.
    if (regions[k].type != SCENECUT_REGION ||
        regions[k].avg_cor_coeff *
                (1 - stats_start[regions[k].start].noise_var /
                         regions[k].avg_intra_err) <
            0.8) {
      continue;
    }
    regions[k].type = HIGH_VAR_REGION;
  }
  cleanup_regions(regions, total_regions);
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    regions[k].start += offset;
    regions[k].last += offset;
  }

  free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                               grad_coded);
  return 0;
}